

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Draw<3u>(StorageMultisampleTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  GLuint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  uint local_20;
  uint local_1c;
  GLuint i_1;
  GLuint i;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfa6);
  (**(code **)(lVar7 + 0x1680))(this->m_po_ms);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glUseProgram has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfaa);
  (**(code **)(lVar7 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfae);
  (**(code **)(lVar7 + 0xb8))(0x8c1a,this->m_to);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfb1);
  pcVar1 = *(code **)(lVar7 + 0x14f0);
  uVar4 = (**(code **)(lVar7 + 0xb48))(this->m_po_ms,"texture_input");
  (*pcVar1)(uVar4,0);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfb4);
  local_1c = 0;
  while( true ) {
    GVar5 = TestReferenceDataDepth<3u>();
    if (GVar5 <= local_1c) break;
    (**(code **)(lVar7 + 0x558))(local_1c + 0x8ce0);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glDrawBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfbb);
    pcVar1 = *(code **)(lVar7 + 0x14f0);
    uVar4 = (**(code **)(lVar7 + 0xb48))(this->m_po_aux,"texture_layer");
    (*pcVar1)(uVar4,local_1c);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfbe);
    (**(code **)(lVar7 + 0x538))(5,0,4);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glDrawArrays has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfc2);
    local_1c = local_1c + 1;
  }
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_aux);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfc9);
  (**(code **)(lVar7 + 0x1680))(this->m_po_aux);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glUseProgram has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfcd);
  (**(code **)(lVar7 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfd1);
  (**(code **)(lVar7 + 0xb8))(0x9102,this->m_to_ms);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfd4);
  (**(code **)(lVar7 + 0xc0))(0,this->m_to);
  pcVar1 = *(code **)(lVar7 + 0x14f0);
  uVar4 = (**(code **)(lVar7 + 0xb48))(this->m_po_aux,"texture_input");
  (*pcVar1)(uVar4,0);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xfd9);
  local_20 = 0;
  while( true ) {
    GVar5 = TestReferenceDataDepth<3u>();
    if (GVar5 <= local_20) break;
    (**(code **)(lVar7 + 0x558))(local_20 + 0x8ce0);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glDrawBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfe0);
    pcVar1 = *(code **)(lVar7 + 0x14f0);
    uVar4 = (**(code **)(lVar7 + 0xb48))(this->m_po_aux,"texture_layer");
    (*pcVar1)(uVar4,local_20);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfe3);
    (**(code **)(lVar7 + 0x538))(5,0,4);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"glDrawArrays has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xfe7);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void StorageMultisampleTest::Draw<3>()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare multisample texture using draw call. */

	/* Prepare framebuffer with multisample texture. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Use first program program. */
	gl.useProgram(m_po_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram has failed");

	/* Prepare texture to be drawn with. */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.uniform1i(gl.getUniformLocation(m_po_ms, "texture_input"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

	/* For each texture layer. */
	for (glw::GLuint i = 0; i < TestReferenceDataDepth<3>(); ++i)
	{
		/* Select layer. */
		gl.drawBuffer(GL_COLOR_ATTACHMENT0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

		gl.uniform1i(gl.getUniformLocation(m_po_aux, "texture_layer"), i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

		/* Draw. */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays has failed");
	}

	/* Copy multisample texture to auxiliary texture using draw call. */

	/* Prepare framebuffer with auxiliary texture. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Use first program program. */
	gl.useProgram(m_po_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram has failed");

	/* Prepare texture to be drawn with. */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_to_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTextureUnit(0, m_to);

	gl.uniform1i(gl.getUniformLocation(m_po_aux, "texture_input"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

	/* For each texture layer. */
	for (glw::GLuint i = 0; i < TestReferenceDataDepth<3>(); ++i)
	{
		/* Select layer. */
		gl.drawBuffer(GL_COLOR_ATTACHMENT0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

		gl.uniform1i(gl.getUniformLocation(m_po_aux, "texture_layer"), i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

		/* Draw. */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays has failed");
	}
}